

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeOperations.cpp
# Opt level: O2

ModuleDeclaration * __thiscall
soul::SourceCodeOperations::findDeclaration(SourceCodeOperations *this,ModuleBase *target)

{
  ModuleDeclaration *m;
  ModuleDeclaration *pMVar1;
  
  pMVar1 = (this->allModules).
           super__Vector_base<soul::SourceCodeOperations::ModuleDeclaration,_std::allocator<soul::SourceCodeOperations::ModuleDeclaration>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (pMVar1 == (this->allModules).
                  super__Vector_base<soul::SourceCodeOperations::ModuleDeclaration,_std::allocator<soul::SourceCodeOperations::ModuleDeclaration>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      throwInternalCompilerError("findDeclaration",0x81);
    }
    if (pMVar1->module == target) break;
    pMVar1 = pMVar1 + 1;
  }
  return pMVar1;
}

Assistant:

SourceCodeOperations::ModuleDeclaration* SourceCodeOperations::findDeclaration (AST::ModuleBase& target)
{
    for (auto& m : allModules)
        if (std::addressof (m.module) == std::addressof (target))
            return std::addressof (m);

    SOUL_ASSERT_FALSE;
    return {};
}